

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O0

void __thiscall
StunMsgCxx_RFC5769SampleRequestLongTerm_Test::TestBody
          (StunMsgCxx_RFC5769SampleRequestLongTerm_Test *this)

{
  bool bVar1;
  base_message<std::allocator<unsigned_char>_> *pbVar2;
  char *pcVar3;
  uint8_t *vec_b;
  pointer pdVar4;
  char *pcVar5;
  msgint mVar6;
  iterator iVar7;
  string local_600;
  AssertHelper local_5e0;
  Message local_5d8;
  decoded local_5d0;
  decoded local_5c0;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_580;
  Message local_578;
  attribute_base<_stun_attr_msgint> local_570;
  undefined1 local_560 [8];
  AssertionResult gtest_ar__5;
  Message local_548;
  uint16_t local_53e;
  attribute_type local_53c;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_8;
  AssertHelper local_508;
  Message local_500;
  decoded local_4f8;
  decoded local_4e8;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar__4;
  Message local_4c0;
  attribute_base<_stun_attr_varsize> local_4b8;
  string local_4a8;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_7;
  Message local_470;
  uint16_t local_466;
  attribute_type local_464;
  undefined1 local_460 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_430;
  Message local_428;
  decoded local_420;
  decoded local_410;
  undefined1 local_400 [8];
  AssertionResult gtest_ar__3;
  Message local_3e8;
  attribute_base<_stun_attr_varsize> local_3e0;
  string local_3d0;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_5;
  Message local_398;
  uint16_t local_38e;
  attribute_type local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_358;
  Message local_350;
  decoded local_348;
  decoded local_338;
  undefined1 local_328 [8];
  AssertionResult gtest_ar__2;
  Message local_310;
  attribute_base<_stun_attr_varsize> local_308;
  string local_2f8;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_3;
  Message local_2c0;
  uint16_t local_2b6;
  attribute_type local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_280;
  Message local_278;
  decoded local_270;
  undefined1 local_260 [8];
  AssertionResult gtest_ar__1;
  iterator i;
  Message local_238;
  uint16_t local_22e;
  type local_22c;
  undefined1 local_228 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_1d0;
  Message local_1c8;
  size_t local_1c0;
  unsigned_long local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  varsize<char> local_190;
  varsize<char> local_170;
  varsize<char> local_140;
  undefined1 local_120 [8];
  message message;
  uint8_t key [16];
  uint8_t tsx_id [12];
  uint8_t expected_result [116];
  char local_68 [8];
  char realm [12];
  char nonce [29];
  char password [10];
  char username [19];
  StunMsgCxx_RFC5769SampleRequestLongTerm_Test *this_local;
  
  stack0xffffffffffffffd8 = 0x83e38883e39e83e3;
  stack0xffffffffffffffc8 = 0x497274614d656854;
  password[0] = 'X';
  password[1] = '\0';
  nonce[8] = 'o';
  nonce[9] = 'L';
  nonce[10] = '9';
  nonce[0xb] = 'F';
  nonce[0xc] = 'S';
  nonce[0xd] = 'T';
  nonce[0xe] = 'v';
  nonce[0xf] = 'y';
  nonce[0x10] = '6';
  nonce[0x11] = '4';
  nonce[0x12] = 's';
  nonce[0x13] = 'A';
  nonce[0x14] = '\0';
  stack0xffffffffffffffa8 = 0x396b3939342f2f66;
  nonce[0] = '5';
  nonce[1] = '4';
  nonce[2] = 'd';
  nonce[3] = '6';
  nonce[4] = 'O';
  nonce[5] = 'L';
  nonce[6] = '3';
  nonce[7] = '4';
  builtin_strncpy(local_68,"example.",8);
  realm[0] = 'o';
  realm[1] = 'r';
  realm[2] = 'g';
  realm[3] = '\0';
  stack0xffffffffffffff18 = 0x42a4122160000100;
  key[8] = 'x';
  key[9] = 0xad;
  key[10] = '4';
  key[0xb] = '3';
  key[0xc] = 0xc6;
  key[0xd] = 0xad;
  key[0xe] = 'r';
  key[0xf] = 0xc0;
  tsx_id[0] = ')';
  tsx_id[1] = 0xda;
  tsx_id[2] = 'A';
  tsx_id[3] = '.';
  pcVar5 = (char *)0x9;
  stun_genkey(password + 8,0x12,local_68,0xb,nonce + 0x18,9,
              (uint8_t *)
              &message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_120,1,key + 8);
  stun::attribute::username(&local_140,password + 8,'\0');
  pbVar2 = stun::operator<<((base_message<std::allocator<unsigned_char>_> *)local_120,&local_140);
  stun::attribute::nonce(&local_170,realm + 8,'\0');
  pbVar2 = stun::operator<<(pbVar2,&local_170);
  stun::attribute::realm(&local_190,local_68,'\0');
  pbVar2 = stun::operator<<(pbVar2,&local_190);
  mVar6 = stun::attribute::message_integrity
                    ((uint8_t *)
                     &message.buffer_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,0x10);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)mVar6.key_;
  stun::operator<<(pbVar2,(msgint *)&gtest_ar.message_);
  local_1b8 = 0x74;
  local_1c0 = stun::base_message<std::allocator<unsigned_char>_>::size
                        ((base_message<std::allocator<unsigned_char>_> *)local_120);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1b0,"sizeof(expected_result)","message.size()",&local_1b8,
             &local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x19f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message(&local_1c8);
  }
  gtest_ar_.message_.ptr_._5_3_ = 0;
  gtest_ar_.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
    vec_b = stun::base_message<std::allocator<unsigned_char>_>::data
                      ((base_message<std::allocator<unsigned_char>_> *)local_120);
    anon_unknown.dwarf_f3ff::IsEqual((anon_unknown_dwarf_f3ff *)local_1e8,tsx_id + 8,vec_b,0x74);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_1e8,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 pcVar5);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1a1,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
    local_22c = binding_request;
    local_22e = stun::base_message<std::allocator<unsigned_char>_>::type
                          ((base_message<std::allocator<unsigned_char>_> *)local_120);
    testing::internal::EqHelper<false>::
    Compare<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((EqHelper<false> *)local_228,"stun::message::binding_request","message.type()",
               &local_22c,&local_22e);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i.attr_.attr_hdr_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1a5,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i.attr_.attr_hdr_,&local_238);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i.attr_.attr_hdr_);
      testing::Message::~Message(&local_238);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
    iVar7 = stun::base_message<std::allocator<unsigned_char>_>::begin
                      ((base_message<std::allocator<unsigned_char>_> *)local_120);
    i.attr_.msg_hdr_ = (stun_msg_hdr *)iVar7.attr_.attr_hdr_;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar7.attr_.msg_hdr_;
    local_270 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                   ((base_message<std::allocator<unsigned_char>_> *)local_120);
    bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                      ((iterator *)&local_270,(self_type *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_260,bVar1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_260,
                 (AssertionResult *)"message.end() != i","false","true",pcVar5);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_280,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1a8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_280,&local_278);
      testing::internal::AssertHelper::~AssertHelper(&local_280);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_278);
    }
    gtest_ar_.message_.ptr_._5_3_ = 0;
    gtest_ar_.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    if (gtest_ar_.message_.ptr_._4_4_ == 0) {
      local_2b4 = username;
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      local_2b6 = stun::attribute::decoded::type(pdVar4);
      testing::internal::EqHelper<false>::
      Compare<stun::attribute::type::attribute_type,unsigned_short>
                ((EqHelper<false> *)local_2b0,"type::username","i->type()",&local_2b4,&local_2b6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
      if (!bVar1) {
        testing::Message::Message(&local_2c0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1a9,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2c0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_2c0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
      pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                         ((iterator *)&gtest_ar__1.message_);
      local_308 = (attribute_base<_stun_attr_varsize>)
                  stun::attribute::decoded::to<(stun::attribute::type::attribute_type)6>(pdVar4);
      stun::attribute::decoding_bits::string::to_string_abi_cxx11_(&local_2f8,(string *)&local_308);
      testing::internal::EqHelper<false>::Compare<char[19],std::__cxx11::string>
                ((EqHelper<false> *)local_2d8,"username","i->to<type::username>().to_string()",
                 (char (*) [19])(password + 8),&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
      if (!bVar1) {
        testing::Message::Message(&local_310);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                   ,0x1ab,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_310)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
        testing::Message::~Message(&local_310);
      }
      gtest_ar_.message_.ptr_._5_3_ = 0;
      gtest_ar_.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
      if (gtest_ar_.message_.ptr_._4_4_ == 0) {
        local_338 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                       ((base_message<std::allocator<unsigned_char>_> *)local_120);
        local_348 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                             operator++((iterator *)&gtest_ar__1.message_);
        bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                          ((iterator *)&local_338,(self_type *)&local_348);
        testing::AssertionResult::AssertionResult((AssertionResult *)local_328,bVar1);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
        if (!bVar1) {
          testing::Message::Message(&local_350);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_4.message_,(internal *)local_328,
                     (AssertionResult *)"message.end() != ++i","false","true",pcVar5);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_358,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                     ,0x1ad,pcVar3);
          testing::internal::AssertHelper::operator=(&local_358,&local_350);
          testing::internal::AssertHelper::~AssertHelper(&local_358);
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_350);
        }
        gtest_ar_.message_.ptr_._5_3_ = 0;
        gtest_ar_.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
        if (gtest_ar_.message_.ptr_._4_4_ == 0) {
          local_38c = nonce;
          pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                             ((iterator *)&gtest_ar__1.message_);
          local_38e = stun::attribute::decoded::type(pdVar4);
          testing::internal::EqHelper<false>::
          Compare<stun::attribute::type::attribute_type,unsigned_short>
                    ((EqHelper<false> *)local_388,"type::nonce","i->type()",&local_38c,&local_38e);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
          if (!bVar1) {
            testing::Message::Message(&local_398);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x1ae,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_398);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_398);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
          pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                             ((iterator *)&gtest_ar__1.message_);
          local_3e0 = (attribute_base<_stun_attr_varsize>)
                      stun::attribute::decoded::to<(stun::attribute::type::attribute_type)21>
                                (pdVar4);
          stun::attribute::decoding_bits::string::to_string_abi_cxx11_
                    (&local_3d0,(string *)&local_3e0);
          testing::internal::EqHelper<false>::Compare<char[29],std::__cxx11::string>
                    ((EqHelper<false> *)local_3b0,"nonce","i->to<type::nonce>().to_string()",
                     (char (*) [29])(realm + 8),&local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
          if (!bVar1) {
            testing::Message::Message(&local_3e8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                       ,0x1b0,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__3.message_,&local_3e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
            testing::Message::~Message(&local_3e8);
          }
          gtest_ar_.message_.ptr_._5_3_ = 0;
          gtest_ar_.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
          if (gtest_ar_.message_.ptr_._4_4_ == 0) {
            local_410 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                           ((base_message<std::allocator<unsigned_char>_> *)
                                            local_120);
            local_420 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                                 operator++((iterator *)&gtest_ar__1.message_);
            bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                              ((iterator *)&local_410,(self_type *)&local_420);
            testing::AssertionResult::AssertionResult((AssertionResult *)local_400,bVar1);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
            if (!bVar1) {
              testing::Message::Message(&local_428);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_6.message_,(internal *)local_400,
                         (AssertionResult *)"message.end() != ++i","false","true",pcVar5);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_430,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                         ,0x1b2,pcVar3);
              testing::internal::AssertHelper::operator=(&local_430,&local_428);
              testing::internal::AssertHelper::~AssertHelper(&local_430);
              std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_428);
            }
            gtest_ar_.message_.ptr_._5_3_ = 0;
            gtest_ar_.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
            if (gtest_ar_.message_.ptr_._4_4_ == 0) {
              local_464 = realm;
              pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                 ((iterator *)&gtest_ar__1.message_);
              local_466 = stun::attribute::decoded::type(pdVar4);
              testing::internal::EqHelper<false>::
              Compare<stun::attribute::type::attribute_type,unsigned_short>
                        ((EqHelper<false> *)local_460,"type::realm","i->type()",&local_464,
                         &local_466);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_460);
              if (!bVar1) {
                testing::Message::Message(&local_470);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_460);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x1b3,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_470);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_470);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_460);
              pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                 ((iterator *)&gtest_ar__1.message_);
              local_4b8 = (attribute_base<_stun_attr_varsize>)
                          stun::attribute::decoded::to<(stun::attribute::type::attribute_type)20>
                                    (pdVar4);
              stun::attribute::decoding_bits::string::to_string_abi_cxx11_
                        (&local_4a8,(string *)&local_4b8);
              testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
                        ((EqHelper<false> *)local_488,"realm","i->to<type::realm>().to_string()",
                         (char (*) [12])local_68,&local_4a8);
              std::__cxx11::string::~string((string *)&local_4a8);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
              if (!bVar1) {
                testing::Message::Message(&local_4c0);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar__4.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                           ,0x1b5,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar__4.message_,&local_4c0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar__4.message_);
                testing::Message::~Message(&local_4c0);
              }
              gtest_ar_.message_.ptr_._5_3_ = 0;
              gtest_ar_.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
              if (gtest_ar_.message_.ptr_._4_4_ == 0) {
                local_4e8 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                               ((base_message<std::allocator<unsigned_char>_> *)
                                                local_120);
                local_4f8 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator::
                                     operator++((iterator *)&gtest_ar__1.message_);
                bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator!=
                                  ((iterator *)&local_4e8,(self_type *)&local_4f8);
                testing::AssertionResult::AssertionResult((AssertionResult *)local_4d8,bVar1);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_4d8);
                if (!bVar1) {
                  testing::Message::Message(&local_500);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&gtest_ar_8.message_,(internal *)local_4d8,
                             (AssertionResult *)"message.end() != ++i","false","true",pcVar5);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_508,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                             ,0x1b7,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_508,&local_500);
                  testing::internal::AssertHelper::~AssertHelper(&local_508);
                  std::__cxx11::string::~string((string *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_500);
                }
                gtest_ar_.message_.ptr_._5_3_ = 0;
                gtest_ar_.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
                if (gtest_ar_.message_.ptr_._4_4_ == 0) {
                  local_53c = message_integrity;
                  pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                     ((iterator *)&gtest_ar__1.message_);
                  local_53e = stun::attribute::decoded::type(pdVar4);
                  testing::internal::EqHelper<false>::
                  Compare<stun::attribute::type::attribute_type,unsigned_short>
                            ((EqHelper<false> *)local_538,"type::message_integrity","i->type()",
                             &local_53c,&local_53e);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_538);
                  if (!bVar1) {
                    testing::Message::Message(&local_548);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_538)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                               ,0x1b8,pcVar3);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__5.message_,&local_548);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar__5.message_);
                    testing::Message::~Message(&local_548);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
                  pdVar4 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator->
                                     ((iterator *)&gtest_ar__1.message_);
                  local_570 = (attribute_base<_stun_attr_msgint>)
                              stun::attribute::decoded::to<(stun::attribute::type::attribute_type)8>
                                        (pdVar4);
                  bVar1 = stun::attribute::decoding_bits::msgint::check_integrity<unsigned_char>
                                    ((msgint *)&local_570,
                                     (uchar *)&message.buffer_.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     key + 8);
                  testing::AssertionResult::AssertionResult((AssertionResult *)local_560,bVar1);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_560);
                  if (!bVar1) {
                    testing::Message::Message(&local_578);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__6.message_,(internal *)local_560,
                               (AssertionResult *)
                               "i->to<type::message_integrity>().check_integrity(key, key + sizeof(key))"
                               ,"false","true",pcVar5);
                    pcVar3 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_580,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                               ,0x1ba,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_580,&local_578);
                    testing::internal::AssertHelper::~AssertHelper(&local_580);
                    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
                    testing::Message::~Message(&local_578);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
                  local_5c0 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                                 ((base_message<std::allocator<unsigned_char>_> *)
                                                  local_120);
                  local_5d0 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::iterator
                                       ::operator++((iterator *)&gtest_ar__1.message_);
                  bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator==
                                    ((iterator *)&local_5c0,(self_type *)&local_5d0);
                  testing::AssertionResult::AssertionResult((AssertionResult *)local_5b0,bVar1);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_5b0);
                  if (!bVar1) {
                    testing::Message::Message(&local_5d8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_600,(internal *)local_5b0,
                               (AssertionResult *)"message.end() == ++i","false","true",pcVar5);
                    pcVar5 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_5e0,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                               ,0x1bc,pcVar5);
                    testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
                    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
                    std::__cxx11::string::~string((string *)&local_600);
                    testing::Message::~Message(&local_5d8);
                  }
                  gtest_ar_.message_.ptr_._5_3_ = 0;
                  gtest_ar_.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
                  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
                    gtest_ar_.message_.ptr_._4_4_ = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  stun::base_message<std::allocator<unsigned_char>_>::~base_message
            ((base_message<std::allocator<unsigned_char>_> *)local_120);
  return;
}

Assistant:

TEST(StunMsgCxx, RFC5769SampleRequestLongTerm) {
  const char username[] =
    "\xE3\x83\x9E\xE3"
    "\x83\x88\xE3\x83"
    "\xAA\xE3\x83\x83"
    "\xE3\x82\xAF\xE3"
    "\x82\xB9";
  const char password[] = "TheMatrIX";
  const char nonce[] = "f//499k954d6OL34oL9FSTvy64sA";
  const char realm[] = "example.org";

  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x60, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0x78,0xad,0x34,0x33, // }
    0xc6,0xad,0x72,0xc0, // }  Transaction ID
    0x29,0xda,0x41,0x2e, // }
    0x00,0x06,0x00,0x12, //    USERNAME attribute header
    0xe3,0x83,0x9e,0xe3, // }
    0x83,0x88,0xe3,0x83, // }
    0xaa,0xe3,0x83,0x83, // }  Username value (0x18,bytes) and padding (2 bytes)
    0xe3,0x82,0xaf,0xe3, // }
    0x82,0xb9,0x00,0x00, // }
    0x00,0x15,0x00,0x1c, //    NONCE attribute header
    0x66,0x2f,0x2f,0x34, // }
    0x39,0x39,0x6b,0x39, // }
    0x35,0x34,0x64,0x36, // }
    0x4f,0x4c,0x33,0x34, // }  Nonce value
    0x6f,0x4c,0x39,0x46, // }
    0x53,0x54,0x76,0x79, // }
    0x36,0x34,0x73,0x41, // }
    0x00,0x14,0x00,0x0b, //    REALM attribute header
    0x65,0x78,0x61,0x6d, // }
    0x70,0x6c,0x65,0x2e, // }  Realm value (0x11,bytes) and padding (1 byte)
    0x6f,0x72,0x67,0x00, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xf6,0x70,0x24,0x65, // }
    0x6d,0xd6,0x4a,0x3e, // }
    0x02,0xb8,0xe0,0x71, // }  HMAC-SHA1 fingerprint
    0x2e,0x85,0xc9,0xa2, // }
    0x8c,0xa8,0x96,0x66, // }
  };

  uint8_t tsx_id[12] = {
    0x78,0xad,0x34,0x33,
    0xc6,0xad,0x72,0xc0,
    0x29,0xda,0x41,0x2e,
  };

  uint8_t key[16];
  stun_genkey(username, sizeof(username)-1, realm, sizeof(realm)-1,
              password, sizeof(password)-1, key);

  stun::message message(stun::message::binding_request, tsx_id);
  message << stun::attribute::username(username)
          << stun::attribute::nonce(nonce)
          << stun::attribute::realm(realm)
          << stun::attribute::message_integrity(key, sizeof(key));
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_request, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::username, i->type());
  ASSERT_EQ(username,
    i->to<type::username>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::nonce, i->type());
  ASSERT_EQ(nonce,
    i->to<type::nonce>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::realm, i->type());
  ASSERT_EQ(realm,
    i->to<type::realm>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(key, key + sizeof(key)));

  ASSERT_TRUE(message.end() == ++i);
}